

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polymer.cpp
# Opt level: O0

void __thiscall Polymer::Bind(Polymer *this,Ptr *pol,string *promoter_name)

{
  pointer *__return_storage_ptr__;
  bool bVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  element_type *peVar5;
  FixedElement *pFVar6;
  element_type *peVar7;
  string *psVar8;
  runtime_error *this_00;
  SpeciesTracker *pSVar9;
  element_type *peVar10;
  bool local_21a;
  shared_ptr<MobileElement> local_158;
  SpeciesTracker *local_148;
  SpeciesTracker *tracker_1;
  string local_138;
  SpeciesTracker *local_118;
  SpeciesTracker *tracker;
  string local_108;
  reference local_e8;
  Interval<std::shared_ptr<BindingSite>,_unsigned_long> *interval;
  iterator __end1;
  iterator __begin1;
  vector<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
  *__range1;
  vector<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
  results;
  undefined1 local_90 [8];
  string err;
  undefined1 local_40 [16];
  undefined1 local_30 [8];
  Ptr elem;
  string *promoter_name_local;
  Ptr *pol_local;
  Polymer *this_local;
  
  elem.super___shared_ptr<BindingSite,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)promoter_name;
  bVar1 = std::operator==(promoter_name,"readthrough");
  if (bVar1) {
    peVar5 = std::__shared_ptr_access<MobileElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<MobileElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)pol);
    MobileElement::start(peVar5,1);
    peVar5 = std::__shared_ptr_access<MobileElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<MobileElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)pol);
    peVar7 = std::__shared_ptr_access<MobileElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<MobileElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)pol);
    iVar3 = MobileElement::footprint(peVar7);
    MobileElement::stop(peVar5,iVar3);
    peVar5 = std::__shared_ptr_access<MobileElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<MobileElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)pol);
    MobileElement::reading_frame(peVar5,1);
  }
  else {
    std::shared_ptr<MobileElement>::shared_ptr((shared_ptr<MobileElement> *)local_40,pol);
    FindBindingSite((Polymer *)local_30,(Ptr *)this,(string *)local_40);
    std::shared_ptr<MobileElement>::~shared_ptr((shared_ptr<MobileElement> *)local_40);
    peVar5 = std::__shared_ptr_access<MobileElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<MobileElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)pol);
    pFVar6 = &std::__shared_ptr_access<BindingSite,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<BindingSite,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)local_30)->super_FixedElement;
    iVar3 = FixedElement::start(pFVar6);
    MobileElement::start(peVar5,iVar3);
    peVar5 = std::__shared_ptr_access<MobileElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<MobileElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)pol);
    pFVar6 = &std::__shared_ptr_access<BindingSite,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<BindingSite,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)local_30)->super_FixedElement;
    iVar3 = FixedElement::start(pFVar6);
    peVar7 = std::__shared_ptr_access<MobileElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<MobileElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)pol);
    iVar4 = MobileElement::footprint(peVar7);
    MobileElement::stop(peVar5,iVar3 + -1 + iVar4);
    peVar5 = std::__shared_ptr_access<MobileElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<MobileElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)pol);
    pFVar6 = &std::__shared_ptr_access<BindingSite,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<BindingSite,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)local_30)->super_FixedElement;
    iVar3 = FixedElement::reading_frame(pFVar6);
    MobileElement::reading_frame(peVar5,iVar3);
    peVar5 = std::__shared_ptr_access<MobileElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<MobileElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)pol);
    psVar8 = MobileElement::name_abi_cxx11_(peVar5);
    bVar1 = std::operator==(psVar8,"__ribosome");
    if (bVar1) {
      peVar5 = std::__shared_ptr_access<MobileElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<MobileElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)pol);
      pFVar6 = &std::__shared_ptr_access<BindingSite,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<BindingSite,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)local_30)->super_FixedElement;
      psVar8 = FixedElement::gene_abi_cxx11_(pFVar6);
      std::__cxx11::string::string((string *)(err.field_2._M_local_buf + 8),(string *)psVar8);
      MobileElement::gene_bound(peVar5,(string *)((long)&err.field_2 + 8));
      std::__cxx11::string::~string((string *)(err.field_2._M_local_buf + 8));
    }
    std::shared_ptr<BindingSite>::~shared_ptr((shared_ptr<BindingSite> *)local_30);
  }
  peVar5 = std::__shared_ptr_access<MobileElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<MobileElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)pol);
  iVar3 = MobileElement::stop(peVar5);
  iVar4 = MobileElement::start(&(this->mask_).super_MobileElement);
  if (iVar3 < iVar4) {
    std::
    vector<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
    ::vector((vector<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
              *)&__range1);
    peVar5 = std::__shared_ptr_access<MobileElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<MobileElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)pol);
    iVar3 = MobileElement::start(peVar5);
    peVar5 = std::__shared_ptr_access<MobileElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<MobileElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)pol);
    iVar4 = MobileElement::stop(peVar5);
    IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long>::findOverlapping
              (&this->binding_sites_,(long)iVar3,(long)iVar4,(intervalVector *)&__range1);
    __end1 = std::
             vector<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
             ::begin((vector<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
                      *)&__range1);
    interval = (Interval<std::shared_ptr<BindingSite>,_unsigned_long> *)
               std::
               vector<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
               ::end((vector<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
                      *)&__range1);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end1,(__normal_iterator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_*,_std::vector<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>_>
                                       *)&interval), bVar1) {
      local_e8 = __gnu_cxx::
                 __normal_iterator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_*,_std::vector<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>_>
                 ::operator*(&__end1);
      pFVar6 = &std::__shared_ptr_access<BindingSite,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<BindingSite,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)&local_e8->value)->super_FixedElement;
      FixedElement::Cover(pFVar6);
      pFVar6 = &std::__shared_ptr_access<BindingSite,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<BindingSite,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)&local_e8->value)->super_FixedElement;
      bVar1 = FixedElement::WasCovered(pFVar6);
      if (bVar1) {
        pFVar6 = &std::__shared_ptr_access<BindingSite,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                  operator->((__shared_ptr_access<BindingSite,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)&local_e8->value)->super_FixedElement;
        psVar8 = FixedElement::name_abi_cxx11_(pFVar6);
        LogCover(this,psVar8);
      }
      pFVar6 = &std::__shared_ptr_access<BindingSite,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<BindingSite,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)&local_e8->value)->super_FixedElement;
      FixedElement::ResetState(pFVar6);
      peVar5 = std::__shared_ptr_access<MobileElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<MobileElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)pol);
      tracker._6_1_ = 0;
      tracker._5_1_ = 0;
      psVar8 = MobileElement::name_abi_cxx11_(peVar5);
      bVar1 = std::operator!=(psVar8,"__rnase");
      local_21a = false;
      if (bVar1) {
        peVar10 = std::__shared_ptr_access<BindingSite,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                  operator->((__shared_ptr_access<BindingSite,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)&local_e8->value);
        std::allocator<char>::allocator();
        tracker._6_1_ = 1;
        std::__cxx11::string::string
                  ((string *)&local_108,"__ribosome",(allocator *)((long)&tracker + 7));
        tracker._5_1_ = 1;
        local_21a = BindingSite::CheckInteraction(peVar10,&local_108);
      }
      if ((tracker._5_1_ & 1) != 0) {
        std::__cxx11::string::~string((string *)&local_108);
      }
      if ((tracker._6_1_ & 1) != 0) {
        std::allocator<char>::~allocator((allocator<char> *)((long)&tracker + 7));
      }
      if (local_21a != false) {
        pSVar9 = SpeciesTracker::Instance();
        local_118 = pSVar9;
        pFVar6 = &std::__shared_ptr_access<BindingSite,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                  operator->((__shared_ptr_access<BindingSite,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)&local_e8->value)->super_FixedElement;
        psVar8 = FixedElement::gene_abi_cxx11_(pFVar6);
        SpeciesTracker::IncrementRibo(pSVar9,psVar8,1);
      }
      peVar5 = std::__shared_ptr_access<MobileElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<MobileElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)pol);
      tracker_1._6_1_ = 0;
      tracker_1._5_1_ = 0;
      psVar8 = MobileElement::name_abi_cxx11_(peVar5);
      bVar2 = std::operator==(psVar8,"__rnase");
      bVar1 = false;
      if (bVar2) {
        peVar10 = std::__shared_ptr_access<BindingSite,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                  operator->((__shared_ptr_access<BindingSite,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)&local_e8->value);
        std::allocator<char>::allocator();
        tracker_1._6_1_ = 1;
        std::__cxx11::string::string
                  ((string *)&local_138,"__ribosome",(allocator *)((long)&tracker_1 + 7));
        tracker_1._5_1_ = 1;
        bVar2 = BindingSite::CheckInteraction(peVar10,&local_138);
        bVar1 = false;
        if (bVar2) {
          peVar10 = std::__shared_ptr_access<BindingSite,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<BindingSite,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)&local_e8->value);
          bVar1 = BindingSite::degraded(peVar10);
          bVar1 = !bVar1;
        }
      }
      if ((tracker_1._5_1_ & 1) != 0) {
        std::__cxx11::string::~string((string *)&local_138);
      }
      if ((tracker_1._6_1_ & 1) != 0) {
        std::allocator<char>::~allocator((allocator<char> *)((long)&tracker_1 + 7));
      }
      if (bVar1) {
        pFVar6 = &std::__shared_ptr_access<BindingSite,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                  operator->((__shared_ptr_access<BindingSite,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)&local_e8->value)->super_FixedElement;
        bVar1 = FixedElement::first_exposure(pFVar6);
        if (bVar1) {
          pSVar9 = SpeciesTracker::Instance();
          local_148 = pSVar9;
          pFVar6 = &std::__shared_ptr_access<BindingSite,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<BindingSite,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)&local_e8->value)->super_FixedElement;
          psVar8 = FixedElement::gene_abi_cxx11_(pFVar6);
          SpeciesTracker::IncrementTranscript(pSVar9,psVar8,-1);
        }
        peVar10 = std::__shared_ptr_access<BindingSite,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                  operator->((__shared_ptr_access<BindingSite,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)&local_e8->value);
        BindingSite::Degrade(peVar10);
      }
      __gnu_cxx::
      __normal_iterator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_*,_std::vector<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>_>
      ::operator++(&__end1);
    }
    std::shared_ptr<MobileElement>::shared_ptr(&local_158,pol);
    (*this->_vptr_Polymer[3])(this,&local_158);
    std::shared_ptr<MobileElement>::~shared_ptr(&local_158);
    std::
    vector<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
    ::~vector((vector<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
               *)&__range1);
    return;
  }
  peVar5 = std::__shared_ptr_access<MobileElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<MobileElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)pol);
  psVar8 = MobileElement::name_abi_cxx11_(peVar5);
  __return_storage_ptr__ =
       &results.
        super__Vector_base<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage;
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 __return_storage_ptr__,"MobileElement ",psVar8);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_90,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 __return_storage_ptr__,
                 " will overlap with mask upon promoter binding. This may cause the polymerase to stall and produce unexpected behavior."
                );
  std::__cxx11::string::~string
            ((string *)
             &results.
              super__Vector_base<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,(string *)local_90);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void Polymer::Bind(MobileElement::Ptr pol, const std::string &promoter_name) {
  // Find a free promoter to bind to
  if (promoter_name == "readthrough") {
    pol->start(1);
    pol->stop(pol->footprint());
    pol->reading_frame(1);
  } else {
    auto elem = FindBindingSite(pol, promoter_name);
    // Update polymerase coordinates
    // (TODO: refactor; pol doesn't need to expose footprint/stop position)
    pol->start(elem->start());
    pol->stop(elem->start() + pol->footprint() - 1);
    pol->reading_frame(elem->reading_frame());
    // Only set gene_bound_ for transcripts and ribosomesinit
    if (pol->name() == "__ribosome") {
      pol->gene_bound(elem->gene());
    }
  }
  // More error checking.
  if (pol->stop() >= mask_.start()) {
    std::string err = "MobileElement " + pol->name() +
                      " will overlap with mask upon promoter binding. This may "
                      "cause the polymerase to stall and produce unexpected "
                      "behavior.";
    throw std::runtime_error(err);
  }
  std::vector<Interval<BindingSite::Ptr>> results;
  binding_sites_.findOverlapping(pol->start(), pol->stop(), results);
  for (auto &interval : results) {
    interval.value->Cover();
    if (interval.value->WasCovered()) {
      // Cover promoter in cache
      LogCover(interval.value->name());
    }
    interval.value->ResetState();
    // Report some data to tracker
    if (pol->name() != "__rnase" &&
        interval.value->CheckInteraction("__ribosome")) {
      auto &tracker = SpeciesTracker::Instance();
      tracker.IncrementRibo(interval.value->gene(), 1);
    }
    if (pol->name() == "__rnase" &&
        interval.value->CheckInteraction("__ribosome") &&
        interval.value->degraded() == false) {
      // Only decrement transcript count if this binding site has
      // been exposed and logged by SpeciesTracker before
      if (interval.value->first_exposure() == true) {
        auto &tracker = SpeciesTracker::Instance();
        tracker.IncrementTranscript(interval.value->gene(), -1);
      }
      interval.value->Degrade();
    }
  }
  // Add polymerase to this polymer
  Attach(pol);
}